

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpegVideo.cpp
# Opt level: O2

void __thiscall MPEGSequenceHeader::setFrameRate(MPEGSequenceHeader *this,uint8_t *buff,double fps)

{
  long lVar1;
  ostream *poVar2;
  undefined4 *puVar3;
  undefined1 *local_1a8;
  undefined8 local_1a0;
  undefined1 local_198;
  undefined7 uStack_197;
  undefined8 uStack_190;
  ostringstream ss;
  
  lVar1 = 1;
  while( true ) {
    if (lVar1 == 9) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
      std::operator<<((ostream *)&ss,"Can\'t set fps to value ");
      poVar2 = std::ostream::_M_insert<double>(fps);
      std::operator<<(poVar2,". Only standard fps values allowed for mpeg2 streams.");
      puVar3 = (undefined4 *)__cxa_allocate_exception(0x28);
      std::__cxx11::stringbuf::str();
      *puVar3 = 0x15e;
      *(undefined4 **)(puVar3 + 2) = puVar3 + 6;
      if (local_1a8 == &local_198) {
        *(ulong *)(puVar3 + 6) = CONCAT71(uStack_197,local_198);
        *(undefined8 *)(puVar3 + 8) = uStack_190;
      }
      else {
        *(undefined1 **)(puVar3 + 2) = local_1a8;
        *(ulong *)(puVar3 + 6) = CONCAT71(uStack_197,local_198);
      }
      *(undefined8 *)(puVar3 + 4) = local_1a0;
      local_198 = 0;
      __cxa_throw(puVar3,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
    }
    if (ABS(frame_rates[lVar1] - fps) < 3e-05) break;
    lVar1 = lVar1 + 1;
  }
  this->frame_rate_index = (uint8_t)lVar1;
  buff[3] = (uint8_t)lVar1 + (buff[3] & 0xf0);
  return;
}

Assistant:

void MPEGSequenceHeader::setFrameRate(uint8_t* buff, const double fps)
{
    for (uint8_t i = 1; i < 9; i++)
        if (std::abs(frame_rates[i] - fps) < FRAME_RATE_EPS)
        {
            frame_rate_index = i;
            buff[3] = (buff[3] & 0xf0) + i;
            return;
        }
    THROW(ERR_MPEG2_ERR_FPS,
          "Can't set fps to value " << fps << ". Only standard fps values allowed for mpeg2 streams.")
}